

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::send
          (WebSocketResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  StringPtr **ppSVar1;
  char cVar2;
  Disposer *pDVar3;
  IdsByNameMap *pIVar4;
  PromiseNode *pPVar5;
  char *pcVar6;
  size_t sVar7;
  AsyncInputStream *pAVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar11;
  Header *pHVar12;
  TransformPromiseNodeBase *this_00;
  HttpHeaderTable *this_01;
  _func_int **pp_Var13;
  int __flags_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  undefined4 in_register_00000034;
  HttpHeaderTable *pHVar15;
  StringPtr *pSVar16;
  undefined4 in_register_00000084;
  void *pvVar17;
  void *__arg;
  __fn *in_R9;
  undefined4 uVar18;
  undefined4 uVar19;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar20;
  char *in_stack_00000008;
  Own<kj::HttpHeaders> headersCopy;
  String statusTextCopy;
  Own<kj::_::PromiseNode> local_128;
  RemoveConst<kj::HttpHeaders::Header> *local_118;
  Header *pHStack_110;
  String local_108;
  Own<kj::_::PromiseNode> local_e8;
  OneWayPipe local_d8;
  undefined1 local_b8 [40];
  RemoveConst<kj::HttpHeaders::Header> *pRStack_90;
  Header *pHStack_88;
  char local_80;
  Array<char> *local_78;
  Maybe<unsigned_long> local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  size_t sVar14;
  
  pvVar17 = (void *)CONCAT44(in_register_00000084,__flags);
  pHVar15 = (HttpHeaderTable *)CONCAT44(in_register_00000034,__fd);
  sVar14 = __n;
  __arg = pvVar17;
  heapString(&local_108,(long)pvVar17 - 1);
  __flags_00 = (int)sVar14;
  __child_stack = extraout_RDX;
  if ((long)pvVar17 - 1U != 0) {
    pSVar16 = (StringPtr *)local_108.content.size_;
    if ((StringPtr *)local_108.content.size_ != (StringPtr *)0x0) {
      pSVar16 = (StringPtr *)local_108.content.ptr;
    }
    memcpy(pSVar16,(void *)__n,(long)pvVar17 - 1U);
    __child_stack = extraout_RDX_00;
  }
  HttpHeaders::clone((HttpHeaders *)local_b8,in_R9,__child_stack,__flags_00,__arg);
  heap<kj::HttpHeaders>((kj *)&local_118,(HttpHeaders *)local_b8);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_b8);
  cVar2 = *in_stack_00000008;
  aVar11 = local_58.ptr.field_1;
  if ((cVar2 == '\x01') &&
     (aVar11.value = ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                     (in_stack_00000008 + 8))->value,
     ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(in_stack_00000008 + 8))->value
     == 0)) {
    local_b8._8_4_ = (int)__buf;
    local_b8._16_8_ = local_108.content.ptr;
    local_b8._24_8_ = local_108.content.size_;
    local_b8._32_8_ = local_108.content.disposer;
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    pRStack_90 = local_118;
    pHStack_88 = pHStack_110;
    pHStack_110 = (Header *)0x0;
    local_78 = (Array<char> *)0x0;
    local_b8._0_8_ = pHVar15;
    local_80 = cVar2;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x70);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&(pHVar15->idsByName).ptr,
               _::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4458:26),_kj::_::PropagateException>
               ::anon_class_72_5_009bee8d_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00446398;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_b8._0_8_;
    *(undefined4 *)&this_00[1].dependency.disposer = local_b8._8_4_;
    this_00[1].dependency.ptr = (PromiseNode *)local_b8._16_8_;
    this_00[1].continuationTracePtr = (void *)local_b8._24_8_;
    local_b8._16_8_ = (char *)0x0;
    local_b8._24_8_ = (Header *)0x0;
    this_00[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_b8._32_8_;
    this_00[2].dependency.disposer = (Disposer *)pRStack_90;
    this_00[2].dependency.ptr = (PromiseNode *)pHStack_88;
    pHStack_88 = (Header *)0x0;
    *(char *)&this_00[2].continuationTracePtr = local_80;
    if (local_80 == '\x01') {
      this_00[3].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_78;
    }
    local_e8.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_e8.ptr = (PromiseNode *)this_00;
    this_01 = (HttpHeaderTable *)operator_new(0x28);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_01,&local_e8,_::IdentityFunc<void>::operator());
    (this_01->namesById).builder.ptr = (StringPtr *)&PTR_onReady_00446420;
    local_128.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Exception&&)#1}>>
          ::instance;
    local_128.ptr = (PromiseNode *)this_01;
    OVar20 = heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                       ((kj *)&local_d8,&local_128);
    pPVar5 = local_128.ptr;
    uVar18 = local_d8.in.ptr._0_4_;
    uVar19 = local_d8.in.ptr._4_4_;
    if ((HttpHeaderTable *)local_128.ptr != (HttpHeaderTable *)0x0) {
      local_128.ptr = (PromiseNode *)0x0;
      local_48 = local_d8.in.disposer._0_4_;
      uStack_44 = local_d8.in.disposer._4_4_;
      uStack_40 = local_d8.in.ptr._0_4_;
      uStack_3c = local_d8.in.ptr._4_4_;
      (**(local_128.disposer)->_vptr_Disposer)
                (local_128.disposer,
                 (((Vector<kj::StringPtr> *)&pPVar5->_vptr_PromiseNode)->builder).ptr[-1].content.
                 ptr + (long)&((Vector<kj::StringPtr> *)&pPVar5->_vptr_PromiseNode)->builder,
                 OVar20.ptr);
      local_d8.in.disposer._0_4_ = local_48;
      local_d8.in.disposer._4_4_ = uStack_44;
      uVar18 = uStack_40;
      uVar19 = uStack_3c;
    }
    pIVar4 = (pHVar15->idsByName).ptr;
    pSVar16 = pHVar15[1].namesById.builder.ptr;
    *(undefined4 *)&(pHVar15->idsByName).ptr = local_d8.in.disposer._0_4_;
    *(undefined4 *)((long)&(pHVar15->idsByName).ptr + 4) = local_d8.in.disposer._4_4_;
    *(undefined4 *)&pHVar15[1].namesById.builder.ptr = uVar18;
    *(undefined4 *)((long)&pHVar15[1].namesById.builder.ptr + 4) = uVar19;
    if (pSVar16 != (StringPtr *)0x0) {
      (*(code *)*(pIVar4->map)._M_h._M_buckets)
                (pIVar4,*(_func_int **)((long)(pSVar16->content).ptr + -0x10) +
                        (long)&pSVar16->content);
    }
    pPVar5 = local_e8.ptr;
    if ((TransformPromiseNodeBase *)local_e8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_e8.ptr = (PromiseNode *)0x0;
      (**(local_e8.disposer)->_vptr_Disposer)
                (local_e8.disposer,
                 ((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode);
    }
    if (pHStack_88 != (Header *)0x0) {
      pHStack_88 = (Header *)0x0;
      (**(_func_int **)(pRStack_90->name).content.ptr)();
    }
    uVar10 = local_b8._24_8_;
    uVar9 = local_b8._16_8_;
    if ((char *)local_b8._16_8_ != (char *)0x0) {
      local_b8._16_8_ = (char *)0x0;
      local_b8._24_8_ = (Header *)0x0;
      (**(_func_int **)(((StringPtr *)local_b8._32_8_)->content).ptr)
                (local_b8._32_8_,uVar9,1,uVar10,uVar10,0);
    }
    pp_Var13 = (_func_int **)operator_new(8);
    *pp_Var13 = (_func_int *)&PTR_write_00445df0;
    (this->super_Response)._vptr_Response =
         (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::NullOutputStream>::instance;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var13;
  }
  else {
    local_58.ptr.field_1 = aVar11;
    local_58.ptr.isSet = (bool)cVar2;
    newOneWayPipe(&local_d8,&local_58);
    ppSVar1 = &(pHVar15->namesById).builder.endPtr;
    *(int *)ppSVar1 = *(int *)ppSVar1 + 1;
    local_128.disposer = (Disposer *)&(pHVar15->namesById).builder.pos;
    local_128.ptr = (PromiseNode *)pHVar15;
    Promise<void>::
    attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>>
              ((Promise<void> *)local_b8,
               (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> *)
               &(pHVar15->idsByName).ptr);
    pHVar12 = (Header *)operator_new(0x30);
    pAVar8 = local_d8.in.ptr;
    pPVar5 = local_128.ptr;
    (pHVar12->name).content.ptr = (char *)&PTR_read_00445e70;
    local_d8.in.ptr = (AsyncInputStream *)0x0;
    (pHVar12->name).content.size_ = CONCAT44(local_d8.in.disposer._4_4_,local_d8.in.disposer._0_4_);
    (pHVar12->value).content.ptr = (char *)pAVar8;
    *(undefined1 *)&(pHVar12->value).content.size_ = 1;
    *(undefined4 *)&pHVar12[1].name.content.ptr = local_b8._0_4_;
    *(undefined4 *)((long)&pHVar12[1].name.content.ptr + 4) = local_b8._4_4_;
    *(undefined4 *)&pHVar12[1].name.content.size_ = local_b8._8_4_;
    *(undefined4 *)((long)&pHVar12[1].name.content.size_ + 4) = local_b8._12_4_;
    if ((HttpHeaderTable *)local_128.ptr != (HttpHeaderTable *)0x0) {
      local_128.ptr = (PromiseNode *)0x0;
      (**(local_128.disposer)->_vptr_Disposer)
                (local_128.disposer,
                 (((Vector<kj::StringPtr> *)&pPVar5->_vptr_PromiseNode)->builder).ptr[-1].content.
                 ptr + (long)&((Vector<kj::StringPtr> *)&pPVar5->_vptr_PromiseNode)->builder);
    }
    pDVar3 = (pHVar15->idsByName).disposer;
    local_b8._0_4_ = (int)__buf;
    local_b8._8_8_ = (StringPtr *)0x36d124;
    if ((StringPtr *)local_108.content.size_ != (StringPtr *)0x0) {
      local_b8._8_8_ = local_108.content.ptr;
    }
    local_b8._16_8_ =
         (long)&((ArrayPtr<const_char> *)local_108.content.size_)->ptr +
         (ulong)((StringPtr *)local_108.content.size_ == (StringPtr *)0x0);
    local_b8._24_8_ = pHStack_110;
    pRStack_90 = (RemoveConst<kj::HttpHeaders::Header> *)operator_new(0x40);
    (pRStack_90->name).content.size_ = (size_t)local_118;
    (pRStack_90->value).content.ptr = (char *)pHStack_110;
    pHStack_110 = (Header *)0x0;
    (pRStack_90->value).content.size_ = (size_t)local_108.content.ptr;
    pRStack_90[1].name.content.ptr = (char *)local_108.content.size_;
    pRStack_90[1].name.content.size_ = (size_t)local_108.content.disposer;
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    pRStack_90[1].value.content.ptr =
         (char *)&_::
                  HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>
                  ::instance;
    pRStack_90[1].value.content.size_ = (size_t)pHVar12;
    (pRStack_90->name).content.ptr = (char *)&PTR_disposeImpl_00447f40;
    local_b8._32_4_ = 1;
    pHStack_88 = pHVar12;
    (**pDVar3->_vptr_Disposer)(pDVar3,local_b8);
    OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::destroy
              ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)(local_b8 + 0x20));
    pAVar8 = local_d8.in.ptr;
    *(undefined4 *)&(this->super_Response)._vptr_Response = local_d8.out.disposer._0_4_;
    *(undefined4 *)((long)&(this->super_Response)._vptr_Response + 4) = local_d8.out.disposer._4_4_;
    *(undefined4 *)&(this->super_Refcounted).super_Disposer._vptr_Disposer = local_d8.out.ptr._0_4_;
    *(undefined4 *)((long)&(this->super_Refcounted).super_Disposer._vptr_Disposer + 4) =
         local_d8.out.ptr._4_4_;
    local_d8.out.ptr = (AsyncOutputStream *)0x0;
    if (local_d8.in.ptr != (AsyncInputStream *)0x0) {
      local_d8.in.ptr = (AsyncInputStream *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_d8.in.disposer._4_4_,local_d8.in.disposer._0_4_))
                ((undefined8 *)CONCAT44(local_d8.in.disposer._4_4_,local_d8.in.disposer._0_4_),
                 pAVar8->_vptr_AsyncInputStream[-2] + (long)&pAVar8->_vptr_AsyncInputStream);
    }
  }
  if (pHStack_110 != (Header *)0x0) {
    pHStack_110 = (Header *)0x0;
    (**(_func_int **)(local_118->name).content.ptr)();
  }
  sVar7 = local_108.content.size_;
  pcVar6 = local_108.content.ptr;
  if (local_108.content.ptr != (char *)0x0) {
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    (**(_func_int **)
       (((StringPtr *)&(local_108.content.disposer)->_vptr_ArrayDisposer)->content).ptr)
              (local_108.content.disposer,pcVar6,1,sVar7,sVar7,0);
  }
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::Own<AsyncInputStream>(kj::heap<NullInputStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy)))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<NullOutputStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        kj::Own<AsyncInputStream> wrapper =
            kj::heap<DelayedEofInputStream>(kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }